

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O3

PList * p_ini_file_sections(PIniFile *file)

{
  pchar *data;
  PList *list;
  PList *pPVar1;
  
  if (((file == (PIniFile *)0x0) || (file->is_parsed == 0)) ||
     (pPVar1 = file->sections, pPVar1 == (PList *)0x0)) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    do {
      data = p_strdup(*pPVar1->data);
      list = p_list_prepend(list,data);
      pPVar1 = pPVar1->next;
    } while (pPVar1 != (PList *)0x0);
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_ini_file_sections (const PIniFile *file)
{
	PList	*ret;
	PList	*sec;

	if (P_UNLIKELY (file == NULL || file->is_parsed == FALSE))
		return NULL;

	ret = NULL;

	for (sec = file->sections; sec != NULL; sec = sec->next)
		ret = p_list_prepend (ret, p_strdup (((PIniSection *) sec->data)->name));

	return ret;
}